

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

Names * __thiscall
cmGeneratorTarget::GetExecutableNames
          (Names *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  string *psVar3;
  cmValue cVar4;
  string prefix;
  string msg;
  string suffix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Names::Names(__return_storage_ptr__);
  bVar1 = IsImported(this);
  if (bVar1) {
    prefix._M_dataplus._M_p = (pointer)0x2e;
    prefix._M_string_length = (size_type)anon_var_dwarf_1604c1d;
    psVar3 = GetName_abi_cxx11_(this);
    suffix._M_string_length = (size_type)(psVar3->_M_dataplus)._M_p;
    suffix._M_dataplus._M_p = (pointer)psVar3->_M_string_length;
    cmStrCat<>(&msg,(cmAlphaNum *)&prefix,(cmAlphaNum *)&suffix);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,&msg);
    std::__cxx11::string::~string((string *)&msg);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&prefix,"VERSION",(allocator<char> *)&suffix);
  cVar4 = GetProperty(this,&prefix);
  std::__cxx11::string::~string((string *)&prefix);
  TVar2 = GetType(this);
  if (TVar2 == EXECUTABLE) {
    this_00 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&prefix,"XCODE",(allocator<char> *)&suffix);
    bVar1 = cmMakefile::IsOn(this_00,&prefix);
    std::__cxx11::string::~string((string *)&prefix);
    if (!bVar1) goto LAB_003dfe0c;
  }
  cVar4.Value = (string *)0x0;
LAB_003dfe0c:
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  prefix._M_string_length = 0;
  prefix.field_2._M_local_buf[0] = '\0';
  suffix._M_dataplus._M_p = (pointer)&suffix.field_2;
  suffix._M_string_length = 0;
  suffix.field_2._M_local_buf[0] = '\0';
  GetFullNameInternal(this,config,RuntimeBinaryArtifact,&prefix,&__return_storage_ptr__->Base,
                      &suffix);
  std::operator+(&local_50,&prefix,&__return_storage_ptr__->Base);
  std::operator+(&msg,&local_50,&suffix);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->Output,(string *)&msg);
  std::__cxx11::string::~string((string *)&msg);
  std::__cxx11::string::~string((string *)&local_50);
  psVar3 = &__return_storage_ptr__->Real;
  std::__cxx11::string::_M_assign((string *)psVar3);
  if (cVar4.Value != (string *)0x0) {
    std::__cxx11::string::append((char *)psVar3);
    std::__cxx11::string::append((string *)psVar3);
  }
  GetFullNameInternal(&msg,this,config,ImportLibraryArtifact);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->ImportLibrary,(string *)&msg);
  std::__cxx11::string::~string((string *)&msg);
  GetPDBName(&msg,this,config);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->PDB,(string *)&msg);
  std::__cxx11::string::~string((string *)&msg);
  std::__cxx11::string::~string((string *)&suffix);
  std::__cxx11::string::~string((string *)&prefix);
  return __return_storage_ptr__;
}

Assistant:

cmGeneratorTarget::Names cmGeneratorTarget::GetExecutableNames(
  const std::string& config) const
{
  cmGeneratorTarget::Names targetNames;

  // This should not be called for imported targets.
  // TODO: Split cmTarget into a class hierarchy to get compile-time
  // enforcement of the limited imported target API.
  if (this->IsImported()) {
    std::string msg = cmStrCat(
      "GetExecutableNames called on imported target: ", this->GetName());
    this->LocalGenerator->IssueMessage(MessageType::INTERNAL_ERROR, msg);
  }

// This versioning is supported only for executables and then only
// when the platform supports symbolic links.
#if defined(_WIN32) && !defined(__CYGWIN__)
  cmValue version;
#else
  // Check for executable version properties.
  cmValue version = this->GetProperty("VERSION");
  if (this->GetType() != cmStateEnums::EXECUTABLE ||
      this->Makefile->IsOn("XCODE")) {
    version = nullptr;
  }
#endif

  // Get the components of the executable name.
  std::string prefix;
  std::string suffix;
  this->GetFullNameInternal(config, cmStateEnums::RuntimeBinaryArtifact,
                            prefix, targetNames.Base, suffix);

  // The executable name.
  targetNames.Output = prefix + targetNames.Base + suffix;

// The executable's real name on disk.
#if defined(__CYGWIN__)
  targetNames.Real = prefix + targetNames.Base;
#else
  targetNames.Real = targetNames.Output;
#endif
  if (version) {
    targetNames.Real += "-";
    targetNames.Real += *version;
  }
#if defined(__CYGWIN__)
  targetNames.Real += suffix;
#endif

  // The import library name.
  targetNames.ImportLibrary =
    this->GetFullNameInternal(config, cmStateEnums::ImportLibraryArtifact);

  // The program database file name.
  targetNames.PDB = this->GetPDBName(config);

  return targetNames;
}